

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void helics::loadPropertiesToml<helics::Translator>
               (Federate *fed,Translator *iface,value *data,bool strict)

{
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  bool bVar1;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *peVar2;
  undefined8 uVar3;
  enable_if_t<detail::is_exact_toml_type<basic_string<char>,_basic_value<type_config>_>::value,_const_cxx::remove_cvref_t<basic_string<char,_char_traits<char>,_allocator<char>_>_>_&>
  pbVar4;
  size_t sVar5;
  floating_type *pfVar6;
  byte in_CL;
  Federate *in_RSI;
  __sv_type _Var7;
  __sv_type _Var8;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *propval_1;
  value uVal_1;
  string propname_1;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *propval;
  value uVal;
  string propname;
  basic_value<toml::type_config> *prop;
  const_iterator __end4;
  const_iterator __begin4;
  array_type *__range4;
  array_type *propArray;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *props;
  key_type *in_stack_fffffffffffffbf8;
  basic_value<toml::type_config> *in_stack_fffffffffffffc00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc10;
  size_t in_stack_fffffffffffffc18;
  char *in_stack_fffffffffffffc20;
  char *pcVar9;
  undefined8 in_stack_fffffffffffffc28;
  int iVar10;
  Federate *in_stack_fffffffffffffc30;
  basic_value<toml::type_config> *in_stack_fffffffffffffc38;
  Federate *in_stack_fffffffffffffc40;
  basic_value<toml::type_config> *in_stack_fffffffffffffc48;
  size_t local_368;
  char *local_360;
  size_t local_358;
  char *local_350;
  size_t local_348;
  char *local_340;
  string *in_stack_fffffffffffffda8;
  value *in_stack_fffffffffffffdb0;
  char local_230 [32];
  __sv_type local_210;
  __sv_type local_200;
  __sv_type local_1f0;
  undefined4 local_1dc;
  string_view local_1d8;
  string_view local_1c8;
  string_view local_1b8;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *local_1a0;
  reference local_b0;
  basic_value<toml::type_config> *local_a8;
  __normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
  local_a0;
  array_type *local_98;
  array_type *local_90;
  allocator<char> local_81 [33];
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *local_60;
  allocator<char> local_41 [40];
  byte local_19;
  Federate *local_10;
  
  local_19 = in_CL & 1;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38,
             (allocator<char> *)in_stack_fffffffffffffc30);
  bVar1 = fileops::isMember(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc00);
  std::allocator<char>::~allocator(local_41);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38,
               (allocator<char> *)in_stack_fffffffffffffc30);
    peVar2 = toml::find<toml::type_config>(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc00);
    std::allocator<char>::~allocator(local_81);
    local_60 = peVar2;
    bVar1 = toml::basic_value<toml::type_config>::is_array
                      ((basic_value<toml::type_config> *)0x217352);
    if (bVar1) {
      local_98 = toml::basic_value<toml::type_config>::as_array
                           ((basic_value<toml::type_config> *)in_stack_fffffffffffffc40);
      local_90 = local_98;
      local_a0._M_current =
           (basic_value<toml::type_config> *)
           std::
           vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
           ::begin((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                    *)in_stack_fffffffffffffbf8);
      local_a8 = (basic_value<toml::type_config> *)
                 std::
                 vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                 ::end((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                        *)in_stack_fffffffffffffbf8);
      while (bVar1 = __gnu_cxx::
                     operator==<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               ((__normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                                 *)in_stack_fffffffffffffc00,
                                (__normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                                 *)in_stack_fffffffffffffbf8), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_b0 = __gnu_cxx::
                   __normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                   ::operator*(&local_a0);
        std::__cxx11::string::string(in_stack_fffffffffffffc10);
        toml::find_or<std::__cxx11::string,toml::type_config,char[5]>
                  (in_stack_fffffffffffffc48,(char (*) [5])in_stack_fffffffffffffc40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc38);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
        toml::basic_value<toml::type_config>::basic_value(in_stack_fffffffffffffc00);
        local_1a0 = toml::find_or<toml::type_config,char[6]>
                              (in_stack_fffffffffffffc48,(char (*) [6])in_stack_fffffffffffffc40,
                               in_stack_fffffffffffffc38);
        bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x217463)
        ;
        if ((bVar1) ||
           (bVar1 = toml::basic_value<toml::type_config>::is_empty
                              ((basic_value<toml::type_config> *)0x217474), bVar1)) {
          iVar10 = (int)((ulong)in_stack_fffffffffffffc28 >> 0x20);
          if ((local_19 & 1) != 0) {
            local_1b8 = loadPropertiesToml<helics::Translator>::errorMessage;
            message_01._M_str = (char *)in_stack_fffffffffffffc40;
            message_01._M_len = (size_t)in_stack_fffffffffffffc38;
            Federate::logMessage(in_stack_fffffffffffffc30,iVar10,message_01);
            uVar3 = __cxa_allocate_exception(0x28);
            local_1c8 = loadPropertiesToml<helics::Translator>::errorMessage;
            message._M_str = in_stack_fffffffffffffc20;
            message._M_len = in_stack_fffffffffffffc18;
            InvalidParameter::InvalidParameter
                      ((InvalidParameter *)in_stack_fffffffffffffc10,message);
            __cxa_throw(uVar3,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
          }
          local_1d8 = loadPropertiesToml<helics::Translator>::errorMessage;
          message_02._M_str = (char *)in_stack_fffffffffffffc40;
          message_02._M_len = (size_t)in_stack_fffffffffffffc38;
          Federate::logMessage(in_stack_fffffffffffffc30,iVar10,message_02);
          local_1dc = 3;
        }
        else {
          bVar1 = toml::basic_value<toml::type_config>::is_floating
                            ((basic_value<toml::type_config> *)0x21762f);
          if (bVar1) {
            in_stack_fffffffffffffc40 = local_10;
            local_1f0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffffc00);
            in_stack_fffffffffffffc48 =
                 (basic_value<toml::type_config> *)
                 toml::basic_value<toml::type_config>::as_floating
                           ((basic_value<toml::type_config> *)in_stack_fffffffffffffc40);
            (*in_stack_fffffffffffffc40->_vptr_Federate[5])
                      (SUB84(*(floating_type *)in_stack_fffffffffffffc48,0),
                       in_stack_fffffffffffffc40,local_1f0._M_len,local_1f0._M_str);
          }
          else {
            in_stack_fffffffffffffc30 = local_10;
            local_200 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffffc00);
            in_stack_fffffffffffffc38 =
                 (basic_value<toml::type_config> *)
                 toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                           ((basic_value<toml::type_config> *)in_stack_fffffffffffffc40);
            local_210 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffffc00);
            (*in_stack_fffffffffffffc30->_vptr_Federate[6])
                      (in_stack_fffffffffffffc30,local_200._M_len,local_200._M_str,local_210._M_len,
                       local_210._M_str);
          }
          local_1dc = 0;
        }
        toml::basic_value<toml::type_config>::~basic_value(in_stack_fffffffffffffc00);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc00);
        __gnu_cxx::
        __normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
        ::operator++(&local_a0);
      }
    }
    else {
      pcVar9 = local_230;
      std::__cxx11::string::string(in_stack_fffffffffffffc10);
      pbVar4 = toml::find_or<std::__cxx11::string,toml::type_config,char[5]>
                         (in_stack_fffffffffffffc48,(char (*) [5])in_stack_fffffffffffffc40,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffc38);
      iVar10 = (int)((ulong)pbVar4 >> 0x20);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
      toml::basic_value<toml::type_config>::basic_value(in_stack_fffffffffffffc00);
      toml::find_or<toml::type_config,char[6]>
                (in_stack_fffffffffffffc48,(char (*) [6])in_stack_fffffffffffffc40,
                 in_stack_fffffffffffffc38);
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x21780e);
      if ((bVar1) ||
         (bVar1 = toml::basic_value<toml::type_config>::is_empty
                            ((basic_value<toml::type_config> *)0x21781f), bVar1)) {
        if ((local_19 & 1) != 0) {
          message_03._M_str = (char *)in_stack_fffffffffffffc40;
          message_03._M_len = (size_t)in_stack_fffffffffffffc38;
          Federate::logMessage(in_stack_fffffffffffffc30,iVar10,message_03);
          sVar5 = __cxa_allocate_exception(0x28);
          message_00._M_str = pcVar9;
          message_00._M_len = sVar5;
          InvalidParameter::InvalidParameter
                    ((InvalidParameter *)in_stack_fffffffffffffc10,message_00);
          __cxa_throw(sVar5,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
        }
        message_04._M_str = (char *)in_stack_fffffffffffffc40;
        message_04._M_len = (size_t)in_stack_fffffffffffffc38;
        Federate::logMessage(in_stack_fffffffffffffc30,iVar10,message_04);
      }
      else {
        bVar1 = toml::basic_value<toml::type_config>::is_floating
                          ((basic_value<toml::type_config> *)0x21793d);
        if (bVar1) {
          _Var7 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffc00);
          pfVar6 = toml::basic_value<toml::type_config>::as_floating
                             ((basic_value<toml::type_config> *)in_stack_fffffffffffffc40);
          local_348 = _Var7._M_len;
          local_340 = _Var7._M_str;
          (*local_10->_vptr_Federate[5])(SUB84(*pfVar6,0),local_10,local_348,local_340);
        }
        else {
          _Var7 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffc00);
          in_stack_fffffffffffffc00 =
               (basic_value<toml::type_config> *)
               toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                         ((basic_value<toml::type_config> *)in_stack_fffffffffffffc40);
          _Var8 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffc00);
          local_358 = _Var7._M_len;
          local_350 = _Var7._M_str;
          local_368 = _Var8._M_len;
          local_360 = _Var8._M_str;
          (*local_10->_vptr_Federate[6])(local_10,local_358,local_350,local_368,local_360);
        }
      }
      toml::basic_value<toml::type_config>::~basic_value(in_stack_fffffffffffffc00);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc00);
    }
  }
  return;
}

Assistant:

static void
    loadPropertiesToml(Federate* fed, INTERFACE& iface, const toml::value& data, bool strict)
{
    static constexpr std::string_view errorMessage =
        R"(interface properties require "name" and "value" fields)";
    if (fileops::isMember(data, "properties")) {
        const auto& props = toml::find(data, "properties");
        if (props.is_array()) {
            const auto& propArray = props.as_array();
            for (const auto& prop : propArray) {
                std::string propname;
                propname = toml::find_or(prop, "name", propname);
                const toml::value uVal;
                const auto& propval = toml::find_or(prop, "value", uVal);

                if ((propname.empty()) || (propval.is_empty())) {
                    if (strict) {
                        fed->logMessage(HELICS_LOG_LEVEL_ERROR, errorMessage);

                        throw(InvalidParameter(errorMessage));
                    }
                    fed->logMessage(HELICS_LOG_LEVEL_WARNING, errorMessage);
                    continue;
                }
                if (propval.is_floating()) {
                    iface.set(propname, propval.as_floating());
                } else {
                    iface.setString(propname, static_cast<std::string_view>(propval.as_string()));
                }
            }
        } else {
            std::string propname;
            propname = toml::find_or(props, "name", propname);
            const toml::value uVal;
            const auto& propval = toml::find_or(props, "value", uVal);

            if ((propname.empty()) || (propval.is_empty())) {
                if (strict) {
                    fed->logMessage(HELICS_LOG_LEVEL_ERROR, errorMessage);

                    throw(InvalidParameter(errorMessage));
                }
                fed->logMessage(HELICS_LOG_LEVEL_WARNING, errorMessage);
            } else {
                if (propval.is_floating()) {
                    iface.set(propname, propval.as_floating());
                } else {
                    iface.setString(propname, static_cast<std::string_view>(propval.as_string()));
                }
            }
        }
    }
}